

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorType colortype;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uchar *out_00;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t bytewidth;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  ulong local_288;
  ulong local_260;
  uint local_238 [8];
  uint local_218 [8];
  uint local_1f8 [8];
  uint local_1d8 [8];
  size_t local_1b8 [8];
  size_t local_178 [7];
  size_t local_140;
  size_t local_138 [8];
  size_t local_f8 [7];
  size_t local_c0;
  size_t local_b8 [8];
  size_t local_78 [9];
  
  colortype = (info_png->color).colortype;
  uVar7 = (info_png->color).bitdepth;
  uVar5 = getNumColorChannels(colortype);
  uVar5 = uVar5 * uVar7;
  if (info_png->interlace_method == 0) {
    uVar6 = uVar5 * w;
    uVar17 = (uVar6 + 7 >> 3) * h;
    uVar16 = uVar17 + h;
    *outsize = (ulong)uVar16;
    puVar8 = (uchar *)malloc((ulong)uVar16);
    *out = puVar8;
    if (uVar16 != 0 && puVar8 == (uchar *)0x0) {
      return 0x53;
    }
    if ((7 < uVar5) || (uVar5 = uVar6 + 7 & 0xfffffff8, uVar6 == uVar5)) {
      uVar7 = filter(puVar8,in,w,h,(LodePNGColorMode *)(ulong)colortype,
                     (LodePNGEncoderSettings *)(ulong)uVar7);
      return uVar7;
    }
    out_00 = (uchar *)malloc((ulong)uVar17);
    if (out_00 == (uchar *)0x0) {
      uVar7 = 0x53;
    }
    else {
      addPaddingBits(out_00,in,(ulong)uVar5,(ulong)uVar6,h);
      uVar7 = filter(puVar8,out_00,w,h,(LodePNGColorMode *)(ulong)colortype,
                     (LodePNGEncoderSettings *)(ulong)uVar7);
    }
  }
  else {
    Adam7_getpassvalues(local_218,local_238,local_178,local_1b8,local_f8,w,h,uVar5);
    *outsize = local_140;
    puVar8 = (uchar *)malloc(local_140);
    *out = puVar8;
    out_00 = (uchar *)malloc(local_c0);
    if ((puVar8 == (uchar *)0x0) || (local_c0 != 0 && out_00 == (uchar *)0x0)) {
LAB_001cc6cb:
      uVar7 = 0x53;
    }
    else {
      Adam7_getpassvalues(local_1d8,local_1f8,local_78,local_b8,local_138,w,h,uVar5);
      if (uVar5 < 8) {
        lVar9 = 0;
        do {
          uVar7 = local_1f8[lVar9];
          if (uVar7 != 0) {
            uVar6 = local_1d8[lVar9];
            uVar16 = 0;
            do {
              if ((ulong)uVar6 != 0) {
                uVar17 = ADAM7_DY[lVar9];
                uVar1 = ADAM7_IY[lVar9];
                uVar2 = ADAM7_DX[lVar9];
                sVar4 = local_138[lVar9];
                uVar3 = ADAM7_IX[lVar9];
                uVar14 = 0;
                do {
                  if (uVar5 != 0) {
                    uVar12 = (ulong)((uVar6 * uVar16 + (int)uVar14) * uVar5) + sVar4 * 8;
                    uVar10 = (ulong)((uVar2 * (int)uVar14 + (uVar17 * uVar16 + uVar1) * w + uVar3) *
                                    uVar5);
                    uVar11 = uVar5;
                    do {
                      bVar15 = '\x01' << (~(byte)uVar12 & 7);
                      if ((in[uVar10 >> 3] >> (~(byte)uVar10 & 7) & 1) == 0) {
                        out_00[uVar12 >> 3] = out_00[uVar12 >> 3] & ~bVar15;
                      }
                      else {
                        out_00[uVar12 >> 3] = out_00[uVar12 >> 3] | bVar15;
                      }
                      uVar12 = uVar12 + 1;
                      uVar10 = uVar10 + 1;
                      uVar11 = uVar11 - 1;
                    } while (uVar11 != 0);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar6);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      else {
        uVar14 = (ulong)(uVar5 >> 3);
        lVar9 = 0;
        do {
          uVar7 = local_1f8[lVar9];
          if ((ulong)uVar7 != 0) {
            uVar10 = (ulong)local_1d8[lVar9];
            local_260 = 0;
            local_288 = 0;
            do {
              if (uVar10 != 0) {
                uVar6 = ADAM7_DX[lVar9];
                sVar4 = local_138[lVar9];
                uVar16 = (ADAM7_DY[lVar9] * (int)local_288 + ADAM7_IY[lVar9]) * w + ADAM7_IX[lVar9];
                uVar12 = local_260;
                uVar13 = uVar10;
                do {
                  memcpy(out_00 + (uVar12 & 0xffffffff) * uVar14 + sVar4,in + uVar16 * uVar14,uVar14
                        );
                  uVar16 = uVar16 + uVar6;
                  uVar12 = uVar12 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              local_288 = local_288 + 1;
              local_260 = local_260 + uVar10;
            } while (local_288 != uVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      lVar9 = 0;
      do {
        if (uVar5 < 8) {
          puVar8 = (uchar *)malloc(*(long *)((long)local_1b8 + lVar9 * 2 + 8) -
                                   *(long *)((long)local_1b8 + lVar9 * 2));
          if (puVar8 == (uchar *)0x0) goto LAB_001cc6cb;
          uVar7 = *(uint *)((long)local_218 + lVar9);
          uVar16 = uVar7 * uVar5;
          uVar6 = *(uint *)((long)local_238 + lVar9);
          addPaddingBits(puVar8,out_00 + *(long *)((long)local_f8 + lVar9 * 2),
                         (ulong)(uVar16 + 7 & 0xfffffff8),(ulong)uVar16,uVar6);
          uVar7 = filter(*out + *(long *)((long)local_178 + lVar9 * 2),puVar8,uVar7,uVar6,
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
          free(puVar8);
        }
        else {
          uVar7 = filter(*out + *(long *)((long)local_178 + lVar9 * 2),
                         out_00 + *(long *)((long)local_1b8 + lVar9 * 2),
                         *(uint *)((long)local_218 + lVar9),*(uint *)((long)local_238 + lVar9),
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
        }
        if (uVar7 != 0) goto LAB_001cc6d4;
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x1c);
      uVar7 = 0;
    }
  }
LAB_001cc6d4:
  free(out_00);
  return uVar7;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0) {
    *outsize = h + (h * ((w * bpp + 7u) / 8u)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, ((w * bpp + 7u) / 8u) * 8u, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7u) / 8u) * 8u, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}